

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktImageLoadStoreTests.cpp
# Opt level: O2

VkDescriptorSetLayout __thiscall
vkt::image::anon_unknown_0::ImageStoreTestInstance::prepareDescriptors(ImageStoreTestInstance *this)

{
  Move<vk::Handle<(vk::HandleType)19>_> *this_00;
  Move<vk::Handle<(vk::HandleType)21>_> *this_01;
  deUint32 numDescriptors;
  VkImage VVar1;
  VkImageSubresourceRange subresourceRange;
  VkImageSubresourceRange subresourceRange_00;
  ImageType imageType;
  VkImageViewType VVar2;
  DeviceInterface *vk;
  VkDevice device;
  DescriptorSetLayoutBuilder *pDVar3;
  DescriptorPoolBuilder *pDVar4;
  ulong uVar5;
  long local_180;
  RefBase<vk::Handle<(vk::HandleType)21>_> local_178;
  RefBase<vk::Handle<(vk::HandleType)19>_> local_158;
  DescriptorSetLayoutBuilder local_138;
  Move<vk::Handle<(vk::HandleType)21>_> *local_e8;
  VkImageSubresourceRange res;
  VkImageSubresourceRange res_1;
  RefBase<vk::Handle<(vk::HandleType)13>_> local_b0;
  RefBase<vk::Handle<(vk::HandleType)22>_> local_90;
  RefBase<vk::Handle<(vk::HandleType)13>_> local_70;
  RefBase<vk::Handle<(vk::HandleType)22>_> local_50;
  
  vk = Context::getDeviceInterface
                 ((this->super_StoreTestInstance).super_BaseTestInstance.super_TestInstance.
                  m_context);
  device = Context::getDevice((this->super_StoreTestInstance).super_BaseTestInstance.
                              super_TestInstance.m_context);
  numDescriptors = (this->super_StoreTestInstance).super_BaseTestInstance.m_texture.m_numLayers;
  ::vk::DescriptorSetLayoutBuilder::DescriptorSetLayoutBuilder(&local_138);
  pDVar3 = ::vk::DescriptorSetLayoutBuilder::addSingleBinding
                     (&local_138,VK_DESCRIPTOR_TYPE_STORAGE_IMAGE,0x20);
  pDVar3 = ::vk::DescriptorSetLayoutBuilder::addSingleBinding
                     (pDVar3,VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER,0x20);
  ::vk::DescriptorSetLayoutBuilder::build
            ((Move<vk::Handle<(vk::HandleType)19>_> *)&local_158,pDVar3,vk,device,0);
  local_178.m_data.deleter.m_device = local_158.m_data.deleter.m_device;
  local_178.m_data.deleter.m_allocator = local_158.m_data.deleter.m_allocator;
  local_178.m_data.object.m_internal = local_158.m_data.object.m_internal;
  local_178.m_data.deleter.m_deviceIface = local_158.m_data.deleter.m_deviceIface;
  local_158.m_data.object.m_internal = 0;
  local_158.m_data.deleter.m_deviceIface = (DeviceInterface *)0x0;
  local_158.m_data.deleter.m_device = (VkDevice)0x0;
  local_158.m_data.deleter.m_allocator = (VkAllocationCallbacks *)0x0;
  this_00 = &this->m_descriptorSetLayout;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)19>_>::reset
            (&this_00->super_RefBase<vk::Handle<(vk::HandleType)19>_>);
  (this->m_descriptorSetLayout).super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.deleter.
  m_device = local_178.m_data.deleter.m_device;
  (this->m_descriptorSetLayout).super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.deleter.
  m_allocator = local_178.m_data.deleter.m_allocator;
  (this_00->super_RefBase<vk::Handle<(vk::HandleType)19>_>).m_data.object.m_internal =
       local_178.m_data.object.m_internal;
  (this->m_descriptorSetLayout).super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.deleter.
  m_deviceIface = local_178.m_data.deleter.m_deviceIface;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)19>_>::~RefBase(&local_158);
  ::vk::DescriptorSetLayoutBuilder::~DescriptorSetLayoutBuilder(&local_138);
  ::vk::DescriptorPoolBuilder::DescriptorPoolBuilder((DescriptorPoolBuilder *)&local_158);
  pDVar4 = ::vk::DescriptorPoolBuilder::addType
                     ((DescriptorPoolBuilder *)&local_158,VK_DESCRIPTOR_TYPE_STORAGE_IMAGE,
                      numDescriptors);
  pDVar4 = ::vk::DescriptorPoolBuilder::addType
                     (pDVar4,VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER,numDescriptors);
  ::vk::DescriptorPoolBuilder::build
            ((Move<vk::Handle<(vk::HandleType)21>_> *)&local_178,pDVar4,vk,device,1,numDescriptors);
  local_138.m_bindings.
  super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_178.m_data.deleter.m_device;
  local_138.m_immutableSamplerInfos.
  super__Vector_base<vk::DescriptorSetLayoutBuilder::ImmutableSamplerInfo,_std::allocator<vk::DescriptorSetLayoutBuilder::ImmutableSamplerInfo>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)local_178.m_data.deleter.m_allocator;
  local_138.m_bindings.
  super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)local_178.m_data.object.m_internal;
  local_138.m_bindings.
  super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_178.m_data.deleter.m_deviceIface;
  local_178.m_data.object.m_internal = 0;
  local_178.m_data.deleter.m_deviceIface = (DeviceInterface *)0x0;
  local_178.m_data.deleter.m_device = (VkDevice)0x0;
  local_178.m_data.deleter.m_allocator = (VkAllocationCallbacks *)0x0;
  this_01 = &this->m_descriptorPool;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)21>_>::reset
            (&this_01->super_RefBase<vk::Handle<(vk::HandleType)21>_>);
  (this->m_descriptorPool).super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.m_device =
       (VkDevice)
       local_138.m_bindings.
       super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (this->m_descriptorPool).super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.m_allocator
       = (VkAllocationCallbacks *)
         local_138.m_immutableSamplerInfos.
         super__Vector_base<vk::DescriptorSetLayoutBuilder::ImmutableSamplerInfo,_std::allocator<vk::DescriptorSetLayoutBuilder::ImmutableSamplerInfo>_>
         ._M_impl.super__Vector_impl_data._M_start;
  (this_01->super_RefBase<vk::Handle<(vk::HandleType)21>_>).m_data.object.m_internal =
       (deUint64)
       local_138.m_bindings.
       super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (this->m_descriptorPool).super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.
  m_deviceIface =
       (DeviceInterface *)
       local_138.m_bindings.
       super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)21>_>::~RefBase(&local_178);
  std::_Vector_base<vk::VkDescriptorPoolSize,_std::allocator<vk::VkDescriptorPoolSize>_>::
  ~_Vector_base((_Vector_base<vk::VkDescriptorPoolSize,_std::allocator<vk::VkDescriptorPoolSize>_> *
                )&local_158);
  if ((this->super_StoreTestInstance).super_BaseTestInstance.m_singleLayerBind == true) {
    local_180 = 0;
    if ((int)numDescriptors < 1) {
      numDescriptors = 0;
    }
    local_e8 = this_01;
    for (uVar5 = 0; numDescriptors != uVar5; uVar5 = uVar5 + 1) {
      makeDescriptorSet((Move<vk::Handle<(vk::HandleType)22>_> *)&local_50,vk,device,
                        (VkDescriptorPool)
                        (local_e8->super_RefBase<vk::Handle<(vk::HandleType)21>_>).m_data.object.
                        m_internal,
                        (VkDescriptorSetLayout)
                        (this_00->super_RefBase<vk::Handle<(vk::HandleType)19>_>).m_data.object.
                        m_internal);
      makeVkSharedPtr<vk::Handle<(vk::HandleType)22>>
                ((image *)&local_138,(Move<vk::Handle<(vk::HandleType)22>_> *)&local_50);
      de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>::operator=
                ((SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_> *)
                 ((long)&((this->m_allDescriptorSets).
                          super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->m_ptr + local_180),
                 (SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_> *)&local_138);
      de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>::~SharedPtr
                ((SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_> *)&local_138);
      ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)22>_>::~RefBase(&local_50);
      VVar1.m_internal =
           (((this->m_image).
             super_UniqueBase<vkt::image::Image,_de::DefaultDeleter<vkt::image::Image>_>.m_data.ptr)
           ->m_image).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.m_internal;
      imageType = getImageTypeForSingleLayer
                            ((this->super_StoreTestInstance).super_BaseTestInstance.m_texture.m_type
                            );
      VVar2 = mapImageViewType(imageType);
      res.aspectMask = 1;
      res.baseMipLevel = 0;
      res.levelCount = 1;
      res.baseArrayLayer = (deUint32)uVar5;
      subresourceRange.baseArrayLayer = res.baseArrayLayer;
      subresourceRange.levelCount = 1;
      subresourceRange.aspectMask = 1;
      subresourceRange.baseMipLevel = 0;
      subresourceRange.layerCount = 1;
      res.layerCount = res.levelCount;
      makeImageView((Move<vk::Handle<(vk::HandleType)13>_> *)&local_70,vk,device,VVar1,VVar2,
                    (this->super_StoreTestInstance).super_BaseTestInstance.m_format,subresourceRange
                   );
      makeVkSharedPtr<vk::Handle<(vk::HandleType)13>>
                ((image *)&local_138,(Move<vk::Handle<(vk::HandleType)13>_> *)&local_70);
      de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>::operator=
                ((SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_> *)
                 ((long)&((this->m_allImageViews).
                          super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->m_ptr + local_180),
                 (SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_> *)&local_138);
      de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>::release
                ((SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_> *)&local_138);
      ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)13>_>::~RefBase(&local_70);
      local_180 = local_180 + 0x10;
    }
  }
  else {
    makeDescriptorSet((Move<vk::Handle<(vk::HandleType)22>_> *)&local_90,vk,device,
                      (VkDescriptorPool)
                      (this_01->super_RefBase<vk::Handle<(vk::HandleType)21>_>).m_data.object.
                      m_internal,
                      (VkDescriptorSetLayout)
                      (this_00->super_RefBase<vk::Handle<(vk::HandleType)19>_>).m_data.object.
                      m_internal);
    makeVkSharedPtr<vk::Handle<(vk::HandleType)22>>
              ((image *)&local_138,(Move<vk::Handle<(vk::HandleType)22>_> *)&local_90);
    de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>::operator=
              ((this->m_allDescriptorSets).
               super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
               (SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_> *)&local_138);
    de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>::~SharedPtr
              ((SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_> *)&local_138);
    ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)22>_>::~RefBase(&local_90);
    VVar1.m_internal =
         (((this->m_image).
           super_UniqueBase<vkt::image::Image,_de::DefaultDeleter<vkt::image::Image>_>.m_data.ptr)->
         m_image).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.m_internal;
    VVar2 = mapImageViewType((this->super_StoreTestInstance).super_BaseTestInstance.m_texture.m_type
                            );
    subresourceRange_00.levelCount = 1;
    subresourceRange_00.baseArrayLayer = 0;
    subresourceRange_00.aspectMask = 1;
    subresourceRange_00.baseMipLevel = 0;
    subresourceRange_00.layerCount = numDescriptors;
    makeImageView((Move<vk::Handle<(vk::HandleType)13>_> *)&local_b0,vk,device,VVar1,VVar2,
                  (this->super_StoreTestInstance).super_BaseTestInstance.m_format,
                  subresourceRange_00);
    makeVkSharedPtr<vk::Handle<(vk::HandleType)13>>
              ((image *)&local_138,(Move<vk::Handle<(vk::HandleType)13>_> *)&local_b0);
    de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>::operator=
              ((this->m_allImageViews).
               super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
               (SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_> *)&local_138);
    de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>::release
              ((SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_> *)&local_138);
    ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)13>_>::~RefBase(&local_b0);
  }
  return (VkDescriptorSetLayout)
         (this_00->super_RefBase<vk::Handle<(vk::HandleType)19>_>).m_data.object.m_internal;
}

Assistant:

VkDescriptorSetLayout ImageStoreTestInstance::prepareDescriptors (void)
{
	const DeviceInterface&	vk		= m_context.getDeviceInterface();
	const VkDevice			device	= m_context.getDevice();

	const int numLayers = m_texture.numLayers();
	m_descriptorSetLayout = DescriptorSetLayoutBuilder()
		.addSingleBinding(VK_DESCRIPTOR_TYPE_STORAGE_IMAGE, VK_SHADER_STAGE_COMPUTE_BIT)
		.addSingleBinding(VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER, VK_SHADER_STAGE_COMPUTE_BIT)
		.build(vk, device);

	m_descriptorPool = DescriptorPoolBuilder()
		.addType(VK_DESCRIPTOR_TYPE_STORAGE_IMAGE, numLayers)
		.addType(VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER, numLayers)
		.build(vk, device, VK_DESCRIPTOR_POOL_CREATE_FREE_DESCRIPTOR_SET_BIT, numLayers);

	if (m_singleLayerBind)
	{
		for (int layerNdx = 0; layerNdx < numLayers; ++layerNdx)
		{
			m_allDescriptorSets[layerNdx] = makeVkSharedPtr(makeDescriptorSet(vk, device, *m_descriptorPool, *m_descriptorSetLayout));
			m_allImageViews[layerNdx]     = makeVkSharedPtr(makeImageView(
												vk, device, m_image->get(), mapImageViewType(getImageTypeForSingleLayer(m_texture.type())), m_format,
												makeImageSubresourceRange(VK_IMAGE_ASPECT_COLOR_BIT, 0u, 1u, layerNdx, 1u)));
		}
	}
	else // bind all layers at once
	{
		m_allDescriptorSets[0] = makeVkSharedPtr(makeDescriptorSet(vk, device, *m_descriptorPool, *m_descriptorSetLayout));
		m_allImageViews[0] = makeVkSharedPtr(makeImageView(
								vk, device, m_image->get(), mapImageViewType(m_texture.type()), m_format,
								makeImageSubresourceRange(VK_IMAGE_ASPECT_COLOR_BIT, 0u, 1u, 0u, numLayers)));
	}

	return *m_descriptorSetLayout;  // not passing the ownership
}